

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

void __thiscall wallet::CWallet::ConnectScriptPubKeyManNotifiers(CWallet *this)

{
  ScriptPubKeyMan *pSVar1;
  bool bVar2;
  reference ppSVar3;
  _Bind<void_(wallet::CWallet::*(wallet::CWallet_*,_std::_Placeholder<2>))(long)> *in_RDI;
  long in_FS_OFFSET;
  ScriptPubKeyMan **spk_man;
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  *__range1;
  iterator __end1;
  iterator __begin1;
  slot<void_(),_boost::function<void_()>_> *in_stack_fffffffffffffe58;
  _Placeholder<2> *in_stack_fffffffffffffe60;
  signal<void_(const_wallet::ScriptPubKeyMan_*,_long),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_wallet::ScriptPubKeyMan_*,_long)>,_boost::function<void_(const_boost::signals2::connection_&,_const_wallet::ScriptPubKeyMan_*,_long)>,_boost::signals2::mutex>
  *in_stack_fffffffffffffe68;
  signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
  *__f;
  slot<void_(),_boost::function<void_()>_> *in_stack_fffffffffffffe88;
  CWallet *in_stack_fffffffffffffed8;
  sockaddr local_120 [3];
  undefined1 local_e8 [72];
  undefined1 local_a0 [72];
  signal<void_(bool),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(bool)>,_boost::function<void_(const_boost::signals2::connection_&,_bool)>,_boost::signals2::mutex>
  local_58;
  _Base_ptr local_40;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  GetActiveScriptPubKeyMans(in_stack_fffffffffffffed8);
  local_40 = (_Base_ptr)
             std::
             set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
             ::begin((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                      *)in_stack_fffffffffffffe60);
  local_58._pimpl.pn.pi_ =
       (sp_counted_base *)
       std::
       set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
       ::end((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
              *)in_stack_fffffffffffffe60);
  while( true ) {
    bVar2 = std::operator==((_Self *)in_stack_fffffffffffffe68,(_Self *)in_stack_fffffffffffffe60);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppSVar3 = std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*>::operator*
                        ((_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> *)
                         in_stack_fffffffffffffe58);
    pSVar1 = *ppSVar3;
    boost::signals2::slot<void(bool),boost::function<void(bool)>>::
    slot<boost::signals2::signal<void(bool),boost::signals2::optional_last_value<void>,int,std::less<int>,boost::function<void(bool)>,boost::function<void(boost::signals2::connection_const&,bool)>,boost::signals2::mutex>>
              ((slot<void_(bool),_boost::function<void_(bool)>_> *)in_stack_fffffffffffffe88,
               (signal<void_(bool),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(bool)>,_boost::function<void_(const_boost::signals2::connection_&,_bool)>,_boost::signals2::mutex>
                *)in_RDI);
    boost::signals2::
    signal<void_(bool),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(bool)>,_boost::function<void_(const_boost::signals2::connection_&,_bool)>,_boost::signals2::mutex>
    ::connect(&local_58,(int)pSVar1 + 0x10,(sockaddr *)(local_a0 + 0x10),0);
    boost::signals2::connection::~connection((connection *)in_stack_fffffffffffffe58);
    boost::signals2::slot<void_(bool),_boost::function<void_(bool)>_>::~slot
              ((slot<void_(bool),_boost::function<void_(bool)>_> *)in_stack_fffffffffffffe58);
    __f = &(*ppSVar3)->NotifyCanGetAddressesChanged;
    boost::signals2::slot<void(),boost::function<void()>>::
    slot<boost::signals2::signal<void(),boost::signals2::optional_last_value<void>,int,std::less<int>,boost::function<void()>,boost::function<void(boost::signals2::connection_const&)>,boost::signals2::mutex>>
              (in_stack_fffffffffffffe88,
               (signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
                *)in_RDI);
    boost::signals2::
    signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
    ::connect((signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
               *)local_a0,(int)__f,(sockaddr *)(local_e8 + 0x10),0);
    boost::signals2::connection::~connection((connection *)in_stack_fffffffffffffe58);
    boost::signals2::slot<void_(),_boost::function<void_()>_>::~slot(in_stack_fffffffffffffe58);
    in_stack_fffffffffffffe68 = &(*ppSVar3)->NotifyFirstKeyTimeChanged;
    std::bind<void(wallet::CWallet::*)(long),wallet::CWallet*,std::_Placeholder<2>const&>
              ((offset_in_CWallet_to_subr *)__f,(CWallet **)in_stack_fffffffffffffe68,
               in_stack_fffffffffffffe60);
    boost::signals2::
    slot<void(wallet::ScriptPubKeyMan_const*,long),boost::function<void(wallet::ScriptPubKeyMan_const*,long)>>
    ::slot<std::_Bind<void(wallet::CWallet::*(wallet::CWallet*,std::_Placeholder<2>))(long)>>
              ((slot<void_(const_wallet::ScriptPubKeyMan_*,_long),_boost::function<void_(const_wallet::ScriptPubKeyMan_*,_long)>_>
                *)in_stack_fffffffffffffe88,in_RDI);
    boost::signals2::
    signal<void_(const_wallet::ScriptPubKeyMan_*,_long),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_wallet::ScriptPubKeyMan_*,_long)>,_boost::function<void_(const_boost::signals2::connection_&,_const_wallet::ScriptPubKeyMan_*,_long)>,_boost::signals2::mutex>
    ::connect((signal<void_(const_wallet::ScriptPubKeyMan_*,_long),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_wallet::ScriptPubKeyMan_*,_long)>,_boost::function<void_(const_boost::signals2::connection_&,_const_wallet::ScriptPubKeyMan_*,_long)>,_boost::signals2::mutex>
               *)local_e8,(int)in_stack_fffffffffffffe68,local_120,0);
    boost::signals2::connection::~connection((connection *)in_stack_fffffffffffffe58);
    boost::signals2::
    slot<void_(const_wallet::ScriptPubKeyMan_*,_long),_boost::function<void_(const_wallet::ScriptPubKeyMan_*,_long)>_>
    ::~slot((slot<void_(const_wallet::ScriptPubKeyMan_*,_long),_boost::function<void_(const_wallet::ScriptPubKeyMan_*,_long)>_>
             *)in_stack_fffffffffffffe58);
    std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*>::operator++
              ((_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> *)in_stack_fffffffffffffe58);
  }
  std::
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::~set((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
          *)in_stack_fffffffffffffe58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::ConnectScriptPubKeyManNotifiers()
{
    for (const auto& spk_man : GetActiveScriptPubKeyMans()) {
        spk_man->NotifyWatchonlyChanged.connect(NotifyWatchonlyChanged);
        spk_man->NotifyCanGetAddressesChanged.connect(NotifyCanGetAddressesChanged);
        spk_man->NotifyFirstKeyTimeChanged.connect(std::bind(&CWallet::MaybeUpdateBirthTime, this, std::placeholders::_2));
    }
}